

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_cod.c
# Opt level: O0

int pnm_type(uint_fast16_t magic)

{
  int local_14;
  int type;
  uint_fast16_t magic_local;
  
  if (magic == 0x5031) {
LAB_0015a902:
    local_14 = 1;
  }
  else {
    if (magic == 0x5032) {
      return 2;
    }
    if (magic != 0x5033) {
      if (magic == 0x5034) goto LAB_0015a902;
      if (magic == 0x5035) {
        return 2;
      }
      if (magic != 0x5036) {
        return 0;
      }
    }
    local_14 = 3;
  }
  return local_14;
}

Assistant:

int pnm_type(uint_fast16_t magic)
{
	int type;
	switch (magic) {
	case PNM_MAGIC_TXTPPM:
	case PNM_MAGIC_BINPPM:
		type = PNM_TYPE_PPM;
		break;
	case PNM_MAGIC_TXTPGM:
	case PNM_MAGIC_BINPGM:
		type = PNM_TYPE_PGM;
		break;
	case PNM_MAGIC_TXTPBM:
	case PNM_MAGIC_BINPBM:
		type = PNM_TYPE_PBM;
		break;
	default:
		/* This should not happen. */
		type = PNM_TYPE_INVALID;
		break;
	}
	return type;
}